

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRanging.cpp
# Opt level: O2

void writeRangingFile(FILE *file,HighsLp *lp,double objective_function_value,HighsBasis *basis,
                     HighsSolution *solution,HighsRanging *ranging,HighsInt style)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  ostream *poVar5;
  long lVar6;
  HighsInt iCol;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  string local_2d8;
  string name;
  array<char,_32UL> up_value;
  array<char,_32UL> dn_value;
  array<char,_32UL> up_objective;
  array<char,_32UL> dn_objective;
  array<char,_32UL> objective;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  if (ranging->valid != false) {
    fwrite("Valid\n",6,1,(FILE *)file);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    pbVar1 = (lp->col_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (lp->col_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = (lp->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (lp->row_names_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    highsDoubleToString(&objective,objective_function_value,1e-13);
    fprintf((FILE *)file,"Objective %s\n",&objective);
    if (style == 1) {
      pcVar9 = 
      "\n                                            Cost ranging\nColumn Status  DownObj    Down                  Value                 Up         UpObj      Name\n"
      ;
      sVar8 = 0x9b;
    }
    else {
      pcVar9 = "\n# Cost ranging\n";
      sVar8 = 0x10;
    }
    fwrite(pcVar9,sVar8,1,(FILE *)file);
    lVar6 = 0;
    for (uVar7 = 0; (long)uVar7 < (long)lp->num_col_; uVar7 = uVar7 + 1) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
      std::__cxx11::string::~string((string *)&name);
      poVar5 = std::operator<<((ostream *)local_1a8,"C");
      std::ostream::operator<<(poVar5,(int)uVar7);
      if (pbVar2 == pbVar1) {
        std::__cxx11::stringbuf::str();
      }
      else {
        std::__cxx11::string::string
                  ((string *)&name,
                   (string *)
                   ((long)&(((lp->col_names_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6))
        ;
      }
      if (style == 1) {
        statusToString_abi_cxx11_
                  (&local_2d8,
                   (basis->col_status).
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],
                   (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],
                   (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7]);
        fprintf((FILE *)file,
                "%6d   %4s  %-10.4g %-10.4g            %-10.4g            %-10.4g %-10.4g %-s\n",
                SUB84((ranging->col_cost_dn).objective_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7],0),
                SUB84((ranging->col_cost_dn).value_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7],0),
                (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7],
                (ranging->col_cost_up).value_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar7],
                (ranging->col_cost_up).objective_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar7],uVar7 & 0xffffffff,
                CONCAT44(local_2d8._M_dataplus._M_p._4_4_,local_2d8._M_dataplus._M_p._0_4_),
                name._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      else {
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->col_cost_dn).objective_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->col_cost_up).objective_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->col_cost_dn).value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->col_cost_up).value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        up_value._M_elems[0x10] = local_2d8.field_2._M_local_buf[0];
        up_value._M_elems[0x11] = local_2d8.field_2._M_local_buf[1];
        up_value._M_elems[0x12] = local_2d8.field_2._M_local_buf[2];
        up_value._M_elems[0x13] = local_2d8.field_2._M_local_buf[3];
        up_value._M_elems[0x14] = local_2d8.field_2._M_local_buf[4];
        up_value._M_elems[0x15] = local_2d8.field_2._M_local_buf[5];
        up_value._M_elems[0x16] = local_2d8.field_2._M_local_buf[6];
        up_value._M_elems[0x17] = local_2d8.field_2._M_local_buf[7];
        up_value._M_elems[0x18] = local_2d8.field_2._M_local_buf[8];
        up_value._M_elems[0x19] = local_2d8.field_2._M_local_buf[9];
        up_value._M_elems[0x1a] = local_2d8.field_2._M_local_buf[10];
        up_value._M_elems[0x1b] = local_2d8.field_2._M_local_buf[0xb];
        up_value._M_elems[0x1c] = local_2d8.field_2._M_local_buf[0xc];
        up_value._M_elems[0x1d] = local_2d8.field_2._M_local_buf[0xd];
        up_value._M_elems[0x1e] = local_2d8.field_2._M_local_buf[0xe];
        up_value._M_elems[0x1f] = local_2d8.field_2._M_local_buf[0xf];
        up_value._M_elems[0] = (char)local_2d8._M_dataplus._M_p;
        up_value._M_elems[1] = local_2d8._M_dataplus._M_p._1_1_;
        up_value._M_elems[2] = local_2d8._M_dataplus._M_p._2_1_;
        up_value._M_elems[3] = local_2d8._M_dataplus._M_p._3_1_;
        up_value._M_elems[4] = local_2d8._M_dataplus._M_p._4_1_;
        up_value._M_elems[5] = local_2d8._M_dataplus._M_p._5_1_;
        up_value._M_elems[6] = local_2d8._M_dataplus._M_p._6_1_;
        up_value._M_elems[7] = local_2d8._M_dataplus._M_p._7_1_;
        up_value._M_elems[8] = (char)local_2d8._M_string_length;
        up_value._M_elems[9] = local_2d8._M_string_length._1_1_;
        up_value._M_elems[10] = local_2d8._M_string_length._2_1_;
        up_value._M_elems[0xb] = local_2d8._M_string_length._3_1_;
        up_value._M_elems[0xc] = local_2d8._M_string_length._4_1_;
        up_value._M_elems[0xd] = local_2d8._M_string_length._5_1_;
        up_value._M_elems[0xe] = local_2d8._M_string_length._6_1_;
        up_value._M_elems[0xf] = local_2d8._M_string_length._7_1_;
        fprintf((FILE *)file,"%-s %s %s %s %s\n",name._M_dataplus._M_p,&dn_objective,&dn_value,
                &up_value,&up_objective);
      }
      std::__cxx11::string::~string((string *)&name);
      lVar6 = lVar6 + 0x20;
    }
    if (style == 1) {
      pcVar9 = 
      "\n                                            Bound ranging\nColumn Status  DownObj    Down       Lower      Value      Upper      Up         UpObj      Name\n"
      ;
      sVar8 = 0x9c;
    }
    else {
      pcVar9 = "\n# Bound ranging\n# Columns\n";
      sVar8 = 0x1b;
    }
    fwrite(pcVar9,sVar8,1,(FILE *)file);
    lVar6 = 0;
    for (uVar7 = 0; (long)uVar7 < (long)lp->num_col_; uVar7 = uVar7 + 1) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
      std::__cxx11::string::~string((string *)&name);
      poVar5 = std::operator<<((ostream *)local_1a8,"C");
      std::ostream::operator<<(poVar5,(int)uVar7);
      if (pbVar2 == pbVar1) {
        std::__cxx11::stringbuf::str();
      }
      else {
        std::__cxx11::string::string
                  ((string *)&name,
                   (string *)
                   ((long)&(((lp->col_names_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6))
        ;
      }
      if (style == 1) {
        statusToString_abi_cxx11_
                  (&local_2d8,
                   (basis->col_status).
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],
                   (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],
                   (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7]);
        fprintf((FILE *)file,
                "%6d   %4s  %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-s\n",
                SUB84((ranging->col_bound_dn).objective_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7],0),
                SUB84((ranging->col_bound_dn).value_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7],0),
                (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7],
                (solution->col_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7],
                (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7],
                (ranging->col_bound_up).value_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar7],
                (ranging->col_bound_up).objective_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar7],uVar7 & 0xffffffff,
                CONCAT44(local_2d8._M_dataplus._M_p._4_4_,local_2d8._M_dataplus._M_p._0_4_),
                name._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      else {
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->col_bound_dn).objective_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->col_bound_up).objective_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->col_bound_dn).value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->col_bound_up).value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        up_value._M_elems[0x10] = local_2d8.field_2._M_local_buf[0];
        up_value._M_elems[0x11] = local_2d8.field_2._M_local_buf[1];
        up_value._M_elems[0x12] = local_2d8.field_2._M_local_buf[2];
        up_value._M_elems[0x13] = local_2d8.field_2._M_local_buf[3];
        up_value._M_elems[0x14] = local_2d8.field_2._M_local_buf[4];
        up_value._M_elems[0x15] = local_2d8.field_2._M_local_buf[5];
        up_value._M_elems[0x16] = local_2d8.field_2._M_local_buf[6];
        up_value._M_elems[0x17] = local_2d8.field_2._M_local_buf[7];
        up_value._M_elems[0x18] = local_2d8.field_2._M_local_buf[8];
        up_value._M_elems[0x19] = local_2d8.field_2._M_local_buf[9];
        up_value._M_elems[0x1a] = local_2d8.field_2._M_local_buf[10];
        up_value._M_elems[0x1b] = local_2d8.field_2._M_local_buf[0xb];
        up_value._M_elems[0x1c] = local_2d8.field_2._M_local_buf[0xc];
        up_value._M_elems[0x1d] = local_2d8.field_2._M_local_buf[0xd];
        up_value._M_elems[0x1e] = local_2d8.field_2._M_local_buf[0xe];
        up_value._M_elems[0x1f] = local_2d8.field_2._M_local_buf[0xf];
        up_value._M_elems[0] = (char)local_2d8._M_dataplus._M_p;
        up_value._M_elems[1] = local_2d8._M_dataplus._M_p._1_1_;
        up_value._M_elems[2] = local_2d8._M_dataplus._M_p._2_1_;
        up_value._M_elems[3] = local_2d8._M_dataplus._M_p._3_1_;
        up_value._M_elems[4] = local_2d8._M_dataplus._M_p._4_1_;
        up_value._M_elems[5] = local_2d8._M_dataplus._M_p._5_1_;
        up_value._M_elems[6] = local_2d8._M_dataplus._M_p._6_1_;
        up_value._M_elems[7] = local_2d8._M_dataplus._M_p._7_1_;
        up_value._M_elems[8] = (char)local_2d8._M_string_length;
        up_value._M_elems[9] = local_2d8._M_string_length._1_1_;
        up_value._M_elems[10] = local_2d8._M_string_length._2_1_;
        up_value._M_elems[0xb] = local_2d8._M_string_length._3_1_;
        up_value._M_elems[0xc] = local_2d8._M_string_length._4_1_;
        up_value._M_elems[0xd] = local_2d8._M_string_length._5_1_;
        up_value._M_elems[0xe] = local_2d8._M_string_length._6_1_;
        up_value._M_elems[0xf] = local_2d8._M_string_length._7_1_;
        fprintf((FILE *)file,"%-s %s %s %s %s\n",name._M_dataplus._M_p,&dn_objective,&dn_value,
                &up_value,&up_objective);
      }
      std::__cxx11::string::~string((string *)&name);
      lVar6 = lVar6 + 0x20;
    }
    if (style == 1) {
      pcVar9 = 
      "                                            Bound ranging\n   Row Status  DownObj    Down       Lower      Value      Upper      Up         UpObj      Name\n"
      ;
      sVar8 = 0x9b;
    }
    else {
      pcVar9 = "# Rows\n";
      sVar8 = 7;
    }
    fwrite(pcVar9,sVar8,1,(FILE *)file);
    lVar6 = 0;
    for (uVar7 = 0; (long)uVar7 < (long)lp->num_row_; uVar7 = uVar7 + 1) {
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
      std::__cxx11::string::~string((string *)&name);
      poVar5 = std::operator<<((ostream *)local_1a8,"R");
      std::ostream::operator<<(poVar5,(int)uVar7);
      if (pbVar3 == pbVar4) {
        std::__cxx11::stringbuf::str();
      }
      else {
        std::__cxx11::string::string
                  ((string *)&name,
                   (string *)
                   ((long)&(((lp->row_names_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6))
        ;
      }
      if (style == 1) {
        statusToString_abi_cxx11_
                  (&local_2d8,
                   (basis->row_status).
                   super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],
                   (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7],
                   (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar7]);
        fprintf((FILE *)file,
                "%6d   %4s  %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-s\n",
                SUB84((ranging->row_bound_dn).objective_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7],0),
                SUB84((ranging->row_bound_dn).value_.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7],0),
                (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7],
                (solution->row_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7],
                (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7],
                (ranging->row_bound_up).value_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar7],
                (ranging->row_bound_up).objective_.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar7],uVar7 & 0xffffffff,
                CONCAT44(local_2d8._M_dataplus._M_p._4_4_,local_2d8._M_dataplus._M_p._0_4_),
                name._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      else {
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->row_bound_dn).objective_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->row_bound_up).objective_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->row_bound_dn).value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        highsDoubleToString((array<char,_32UL> *)&local_2d8,
                            (ranging->row_bound_up).value_.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7],1e-13);
        up_value._M_elems[0x10] = local_2d8.field_2._M_local_buf[0];
        up_value._M_elems[0x11] = local_2d8.field_2._M_local_buf[1];
        up_value._M_elems[0x12] = local_2d8.field_2._M_local_buf[2];
        up_value._M_elems[0x13] = local_2d8.field_2._M_local_buf[3];
        up_value._M_elems[0x14] = local_2d8.field_2._M_local_buf[4];
        up_value._M_elems[0x15] = local_2d8.field_2._M_local_buf[5];
        up_value._M_elems[0x16] = local_2d8.field_2._M_local_buf[6];
        up_value._M_elems[0x17] = local_2d8.field_2._M_local_buf[7];
        up_value._M_elems[0x18] = local_2d8.field_2._M_local_buf[8];
        up_value._M_elems[0x19] = local_2d8.field_2._M_local_buf[9];
        up_value._M_elems[0x1a] = local_2d8.field_2._M_local_buf[10];
        up_value._M_elems[0x1b] = local_2d8.field_2._M_local_buf[0xb];
        up_value._M_elems[0x1c] = local_2d8.field_2._M_local_buf[0xc];
        up_value._M_elems[0x1d] = local_2d8.field_2._M_local_buf[0xd];
        up_value._M_elems[0x1e] = local_2d8.field_2._M_local_buf[0xe];
        up_value._M_elems[0x1f] = local_2d8.field_2._M_local_buf[0xf];
        up_value._M_elems[0] = (char)local_2d8._M_dataplus._M_p;
        up_value._M_elems[1] = local_2d8._M_dataplus._M_p._1_1_;
        up_value._M_elems[2] = local_2d8._M_dataplus._M_p._2_1_;
        up_value._M_elems[3] = local_2d8._M_dataplus._M_p._3_1_;
        up_value._M_elems[4] = local_2d8._M_dataplus._M_p._4_1_;
        up_value._M_elems[5] = local_2d8._M_dataplus._M_p._5_1_;
        up_value._M_elems[6] = local_2d8._M_dataplus._M_p._6_1_;
        up_value._M_elems[7] = local_2d8._M_dataplus._M_p._7_1_;
        up_value._M_elems[8] = (char)local_2d8._M_string_length;
        up_value._M_elems[9] = local_2d8._M_string_length._1_1_;
        up_value._M_elems[10] = local_2d8._M_string_length._2_1_;
        up_value._M_elems[0xb] = local_2d8._M_string_length._3_1_;
        up_value._M_elems[0xc] = local_2d8._M_string_length._4_1_;
        up_value._M_elems[0xd] = local_2d8._M_string_length._5_1_;
        up_value._M_elems[0xe] = local_2d8._M_string_length._6_1_;
        up_value._M_elems[0xf] = local_2d8._M_string_length._7_1_;
        fprintf((FILE *)file,"%-s %s %s %s %s\n",name._M_dataplus._M_p,&dn_objective,&dn_value,
                &up_value,&up_objective);
      }
      std::__cxx11::string::~string((string *)&name);
      lVar6 = lVar6 + 0x20;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  fwrite("None\n",5,1,(FILE *)file);
  return;
}

Assistant:

void writeRangingFile(FILE* file, const HighsLp& lp,
                      const double objective_function_value,
                      const HighsBasis& basis, const HighsSolution& solution,
                      const HighsRanging& ranging, const HighsInt style) {
  if (!ranging.valid) {
    fprintf(file, "None\n");
    return;
  }
  fprintf(file, "Valid\n");
  std::stringstream ss;
  const bool have_col_names = lp.col_names_.size() > 0;
  const bool have_row_names = lp.row_names_.size() > 0;
  const bool pretty = style == kSolutionStylePretty;
  const char* pretty_cost_format =
      "%6d   %4s  %-10.4g %-10.4g            %-10.4g            %-10.4g "
      "%-10.4g %-s\n";
  const char* raw_cost_format = "%-s %s %s %s %s\n";

  const char* pretty_bound_format =
      "%6d   %4s  %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g %-10.4g "
      "%-s\n";
  const char* raw_bound_format = "%-s %s %s %s %s\n";

  std::array<char, 32> dn_objective;
  std::array<char, 32> up_objective;
  std::array<char, 32> dn_value;
  std::array<char, 32> up_value;

  auto objective = highsDoubleToString(objective_function_value,
                                       kRangingValueToStringTolerance);
  fprintf(file, "Objective %s\n", objective.data());
  if (pretty) {
    fprintf(file,
            "\n                                            Cost ranging\n"
            "Column Status  DownObj    Down                  Value             "
            "    Up         UpObj      Name\n");
  } else {
    fprintf(file, "\n# Cost ranging\n");
  }
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    // Create a column name
    ss.str(std::string());
    ss << "C" << iCol;
    const std::string name = have_col_names ? lp.col_names_[iCol] : ss.str();
    if (pretty) {
      fprintf(file, pretty_cost_format, (int)iCol,
              statusToString(basis.col_status[iCol], lp.col_lower_[iCol],
                             lp.col_upper_[iCol])
                  .c_str(),
              ranging.col_cost_dn.objective_[iCol],
              ranging.col_cost_dn.value_[iCol], lp.col_cost_[iCol],
              ranging.col_cost_up.value_[iCol],
              ranging.col_cost_up.objective_[iCol], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.col_cost_dn.objective_[iCol],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.col_cost_up.objective_[iCol],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.col_cost_dn.value_[iCol],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.col_cost_up.value_[iCol],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_cost_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }
  if (pretty) {
    fprintf(file,
            "\n                                            Bound ranging\n"
            "Column Status  DownObj    Down       Lower      Value      Upper "
            "     Up         UpObj      Name\n");
  } else {
    fprintf(file, "\n# Bound ranging\n# Columns\n");
  }
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    // Create a column name
    ss.str(std::string());
    ss << "C" << iCol;
    const std::string name = have_col_names ? lp.col_names_[iCol] : ss.str();
    if (pretty) {
      fprintf(file, pretty_bound_format, (int)iCol,
              statusToString(basis.col_status[iCol], lp.col_lower_[iCol],
                             lp.col_upper_[iCol])
                  .c_str(),
              ranging.col_bound_dn.objective_[iCol],
              ranging.col_bound_dn.value_[iCol], lp.col_lower_[iCol],
              solution.col_value[iCol], lp.col_upper_[iCol],
              ranging.col_bound_up.value_[iCol],
              ranging.col_bound_up.objective_[iCol], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.col_bound_dn.objective_[iCol],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.col_bound_up.objective_[iCol],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.col_bound_dn.value_[iCol],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.col_bound_up.value_[iCol],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_bound_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }

  if (pretty) {
    fprintf(file,
            "                                            Bound ranging\n"
            "   Row Status  DownObj    Down       Lower      Value      Upper "
            "     Up         UpObj      Name\n");
  } else {
    fprintf(file, "# Rows\n");
  }
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    // Create a row name
    ss.str(std::string());
    ss << "R" << iRow;
    const std::string name = have_row_names ? lp.row_names_[iRow] : ss.str();
    if (pretty) {
      fprintf(file, pretty_bound_format, (int)iRow,
              statusToString(basis.row_status[iRow], lp.row_lower_[iRow],
                             lp.row_upper_[iRow])
                  .c_str(),
              ranging.row_bound_dn.objective_[iRow],
              ranging.row_bound_dn.value_[iRow], lp.row_lower_[iRow],
              solution.row_value[iRow], lp.row_upper_[iRow],
              ranging.row_bound_up.value_[iRow],
              ranging.row_bound_up.objective_[iRow], name.c_str());
    } else {
      dn_objective = highsDoubleToString(ranging.row_bound_dn.objective_[iRow],
                                         kRangingValueToStringTolerance);
      up_objective = highsDoubleToString(ranging.row_bound_up.objective_[iRow],
                                         kRangingValueToStringTolerance);
      dn_value = highsDoubleToString(ranging.row_bound_dn.value_[iRow],
                                     kRangingValueToStringTolerance);
      up_value = highsDoubleToString(ranging.row_bound_up.value_[iRow],
                                     kRangingValueToStringTolerance);
      fprintf(file, raw_bound_format, name.c_str(), dn_objective.data(),
              dn_value.data(), up_value.data(), up_objective.data());
    }
  }
}